

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O0

int main(void)

{
  allocator<std::thread> *this;
  bool bVar1;
  int iVar2;
  uint __af;
  ostream *poVar3;
  char *pcVar4;
  void *__cp;
  reference pvVar5;
  reference this_00;
  value_type local_2cc;
  reference_wrapper<std::vector<cUser,_std::allocator<cUser>_>_> rStack_2c8;
  int i_2;
  reference_wrapper<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c0;
  reference_wrapper<bool[10]> local_2b8;
  reference_wrapper<bool[10]> local_2b0;
  thread local_2a8;
  value_type local_29c;
  value_type local_298;
  int nextIndex;
  int i_1;
  int i;
  queue<int,_std::deque<int,_std::allocator<int>_>_> ordering;
  undefined1 local_238 [8];
  vector<std::thread,_std::allocator<std::thread>_> threads;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_209;
  undefined1 local_208 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  msgs;
  bool msgFlags [10];
  bool finished [10];
  vector<cUser,_std::allocator<cUser>_> currUsers;
  char local_1b8 [4];
  int rv;
  char s [46];
  undefined4 local_17c [2];
  int yes;
  sigaction sa;
  undefined1 local_d8 [4];
  socklen_t sin_size;
  sockaddr_storage their_addr;
  addrinfo *p;
  addrinfo *servinfo;
  addrinfo hints;
  int numbytes;
  int new_fd;
  int sockfd;
  
  local_17c[0] = 1;
  std::vector<cUser,_std::allocator<cUser>_>::vector
            ((vector<cUser,_std::allocator<cUser>_> *)(finished + 2));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_209);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_208,10,&local_209);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_209);
  this = (allocator<std::thread> *)
         ((long)&ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node + 7);
  std::allocator<std::thread>::allocator(this);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_238,10,this);
  std::allocator<std::thread>::~allocator
            ((allocator<std::thread> *)
             ((long)&ordering.c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node + 7));
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,std::deque<int,std::allocator<int>>> *)&i_1);
  for (nextIndex = 0; nextIndex < 10; nextIndex = nextIndex + 1) {
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i_1,&nextIndex);
    msgFlags[(long)nextIndex + 2] = false;
    *(undefined1 *)
     ((long)&msgs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)nextIndex + 4) = 0;
  }
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  hints.ai_flags = 1;
  hints.ai_family = 0;
  servinfo = (addrinfo *)0x1;
  iVar2 = getaddrinfo((char *)0x0,"3491",(addrinfo *)&servinfo,(addrinfo **)&p);
  if (iVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"getaddrinfo: ");
    pcVar4 = gai_strerror(iVar2);
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::~queue
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i_1);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_208);
    std::vector<cUser,_std::allocator<cUser>_>::~vector
              ((vector<cUser,_std::allocator<cUser>_> *)(finished + 2));
    return 1;
  }
  for (their_addr.__ss_align = (unsigned_long)p; their_addr.__ss_align != 0;
      their_addr.__ss_align = *(unsigned_long *)(their_addr.__ss_align + 0x28)) {
    numbytes = socket(*(int *)(their_addr.__ss_align + 4),*(int *)(their_addr.__ss_align + 8),
                      *(int *)(their_addr.__ss_align + 0xc));
    if (numbytes == -1) {
      perror("server: socket");
    }
    else {
      iVar2 = setsockopt(numbytes,1,2,local_17c,4);
      if (iVar2 == -1) {
        perror("setsockopt");
        exit(1);
      }
      iVar2 = bind(numbytes,*(sockaddr **)(their_addr.__ss_align + 0x18),
                   *(socklen_t *)(their_addr.__ss_align + 0x10));
      if (iVar2 != -1) break;
      close(numbytes);
      perror("server: bind");
    }
  }
  freeaddrinfo((addrinfo *)p);
  if (their_addr.__ss_align == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"server: failed to bind");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  iVar2 = listen(numbytes,5);
  if (iVar2 == -1) {
    perror("listen");
    exit(1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"My chat room server. Version Two.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
LAB_0010d9dd:
  while (bVar1 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::empty
                           ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i_1), bVar1) {
    for (local_298 = 0; local_298 < 10; local_298 = local_298 + 1) {
      if ((msgFlags[(long)local_298 + 2] & 1U) != 0) {
        msgFlags[(long)local_298 + 2] = false;
        *(undefined1 *)
         ((long)&msgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)local_298 + 4) = 0;
        std::vector<std::thread,_std::allocator<std::thread>_>::at
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_238,(long)local_298);
        std::thread::join();
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i_1,&local_298);
      }
    }
  }
  sa.sa_restorer._4_4_ = 0x80;
  hints.ai_next._4_4_ = 0;
  hints.ai_next._4_4_ =
       accept(numbytes,(sockaddr *)local_d8,(socklen_t *)((long)&sa.sa_restorer + 4));
  if (hints.ai_next._4_4_ != -1) goto LAB_0010daf0;
  perror("accept");
  goto LAB_0010dafd;
LAB_0010daf0:
  if (hints.ai_next._4_4_ != 0) {
LAB_0010dafd:
    __af = (uint)(ushort)local_d8._0_2_;
    __cp = get_in_addr((sockaddr *)local_d8);
    inet_ntop(__af,__cp,local_1b8,0x2e);
    pvVar5 = std::queue<int,_std::deque<int,_std::allocator<int>_>_>::front
                       ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i_1);
    local_29c = *pvVar5;
    std::queue<int,_std::deque<int,_std::allocator<int>_>_>::pop
              ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i_1);
    local_2b0 = std::ref<bool[10]>((bool (*) [10])(msgFlags + 2));
    local_2b8 = std::ref<bool[10]>((bool (*) [10])
                                   ((long)&msgs.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    local_2c0 = std::ref<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_208);
    rStack_2c8 = std::ref<std::vector<cUser,std::allocator<cUser>>>
                           ((vector<cUser,_std::allocator<cUser>_> *)(finished + 2));
    std::thread::
    thread<void(&)(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&),int&,int&,std::reference_wrapper<bool[10]>,std::reference_wrapper<bool[10]>,std::reference_wrapper<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::reference_wrapper<std::vector<cUser,std::allocator<cUser>>>,void>
              (&local_2a8,threadFunc,&local_29c,(int *)((long)&hints.ai_next + 4),&local_2b0,
               &local_2b8,&local_2c0,&stack0xfffffffffffffd38);
    this_00 = std::vector<std::thread,_std::allocator<std::thread>_>::at
                        ((vector<std::thread,_std::allocator<std::thread>_> *)local_238,
                         (long)local_29c);
    std::thread::operator=(this_00,&local_2a8);
    std::thread::~thread(&local_2a8);
    for (local_2cc = 0; local_2cc < 10; local_2cc = local_2cc + 1) {
      if ((msgFlags[(long)local_2cc + 2] & 1U) != 0) {
        std::vector<std::thread,_std::allocator<std::thread>_>::at
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_238,(long)local_2cc);
        std::thread::join();
        msgFlags[(long)local_2cc + 2] = false;
        *(undefined1 *)
         ((long)&msgs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)local_2cc + 4) = 0;
        std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
                  ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&i_1,&local_2cc);
      }
    }
  }
  goto LAB_0010d9dd;
}

Assistant:

int main(){


    //the thousand of varibles needed to run these sockets
    int sockfd, new_fd, numbytes;  // listen on sock_fd, new connection on new_fd
    struct addrinfo hints, *servinfo, *p;
    struct sockaddr_storage their_addr; // connector's address information
    socklen_t sin_size;
    struct sigaction sa;
    int yes=1;
    char s[INET6_ADDRSTRLEN];
    int rv;



    //session based varibles to pass all the info around
    vector<cUser> currUsers;
    bool finished[MAX_NUM_THREADS];
    bool msgFlags[MAX_NUM_THREADS];
    vector<string> msgs(MAX_NUM_THREADS);
    vector<thread> threads(MAX_NUM_THREADS);
    queue<int> ordering;


    //initialize message queue and thread quit flags
    for(int i=0; i<MAX_NUM_THREADS; i++){
        ordering.push(i);
        finished[i] = false;
        msgFlags[i] = false;
    }

    //zero out the address space of the strucutre for safty
    memset(&hints, 0, sizeof hints);

    // like client this allows for IPV4 and IPV6
    hints.ai_family = AF_UNSPEC;
    hints.ai_socktype = SOCK_STREAM;

    //use same ip address as return address
    hints.ai_flags = AI_PASSIVE;

    //get the info to create the socket
    if ((rv = getaddrinfo(NULL, PORT, &hints, &servinfo)) != 0) {
        cerr << "getaddrinfo: " <<  gai_strerror(rv) << endl;
        return 1;
    }

    // loop through all the results and bind to the first we can
    for(p = servinfo; p != NULL; p = p->ai_next) {

        if ((sockfd = socket(p->ai_family, p->ai_socktype,
                p->ai_protocol)) == -1) {
            perror("server: socket");
            continue;
        }

        if (setsockopt(sockfd, SOL_SOCKET, SO_REUSEADDR, &yes,
                sizeof(int)) == -1) {
            perror("setsockopt");
            exit(1);
        }

        //bind to the socket address
        if (bind(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
            close(sockfd);
            perror("server: bind");
            continue;
        }

        break;
    }


    freeaddrinfo(servinfo); // all done with this structure

    //check if something went wrong
    if (p == NULL)  {
        cerr << "server: failed to bind" << endl;
        exit(1);
    }

    //start listening on the socket
    if (listen(sockfd, BACKLOG) == -1) {
        perror("listen");
        exit(1);
    }

    //init message
    cout << "My chat room server. Version Two." << endl;




    while(1){

        //if at max clients what to accept until a connection was closed
        //stops people over max number of connections from connecting
        while(ordering.empty()){
            for(int i=0; i<MAX_NUM_THREADS; i++){
                if(finished[i]){
                    finished[i] = false;
                    msgFlags[i] = false;
                    threads.at(i).join();
                    ordering.push(i);
                }
            }
        }

        //get the accepted connection
        sin_size = sizeof their_addr;
        new_fd = 0;
        new_fd = accept(sockfd, (struct sockaddr *)&their_addr, &sin_size);

        //check for errors
        if (new_fd == -1) {
            perror("accept");
        }
        else if(new_fd == 0){
            //cout << "testing";
            continue;
        }

        //turn the address from binary to family friendly G rated words
        //I don't use this here but I will definily later, this is really cool :)
        inet_ntop(their_addr.ss_family,
            get_in_addr((struct sockaddr *)&their_addr),
            s, sizeof s);


        //cout << "server: got connection from " <<  s << endl;

        //get the next threadid to spawn
        int nextIndex = ordering.front();
        ordering.pop();

        //spawn a thread for the new connection made
        threads.at(nextIndex) = thread(threadFunc,nextIndex,new_fd,
            ref(finished),ref(msgFlags),ref(msgs),ref(currUsers));


        //check if any clients have quite, reap the thread and free the index
        // make sure to set the flags back and add the index back to the queue
        for(int i=0; i<MAX_NUM_THREADS; i++){
            if(finished[i]){
                threads.at(i).join();
                finished[i] = false;
                msgFlags[i] = false;
                ordering.push(i);
            }
        }


    }

    //tity up everyting
    close(sockfd);

    return 0;
}